

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O0

int __thiscall deqp::egl::InfoTests::init(InfoTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  QueryStringCase *pQVar1;
  TestNode *pTVar2;
  InfoTests *this_local;
  
  pQVar1 = (QueryStringCase *)operator_new(0x90);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_eglTestCtx,"version","EGL Version",0x3054);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pQVar1 = (QueryStringCase *)operator_new(0x90);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_eglTestCtx,"vendor","EGL Vendor",0x3053);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pQVar1 = (QueryStringCase *)operator_new(0x90);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_eglTestCtx,"client_apis","Supported client APIs",
             0x308d);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pTVar2 = (TestNode *)operator_new(0x88);
  QueryExtensionsCase::QueryExtensionsCase
            ((QueryExtensionsCase *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  ConfigList::ConfigList((ConfigList *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void InfoTests::init (void)
{
	addChild(new QueryStringCase(m_eglTestCtx, "version",		"EGL Version",				EGL_VERSION));
	addChild(new QueryStringCase(m_eglTestCtx, "vendor",		"EGL Vendor",				EGL_VENDOR));
	addChild(new QueryStringCase(m_eglTestCtx, "client_apis",	"Supported client APIs",	EGL_CLIENT_APIS));
	addChild(new QueryExtensionsCase(m_eglTestCtx));
	addChild(new ConfigList(m_eglTestCtx));
}